

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

string * __thiscall
jsoncons::jsonpath::detail::
union_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
::to_string_abi_cxx11_
          (union_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,int level)

{
  bool bVar1;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  **selector;
  const_iterator __end0;
  const_iterator __begin0;
  vector<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::allocator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*>_>
  *__range3;
  string *s;
  vector<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::allocator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*>_>
  *in_stack_ffffffffffffff78;
  string *__lhs;
  string local_68 [32];
  reference local_48;
  jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  **local_40;
  __normal_iterator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*const_*,_std::vector<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::allocator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*>_>_>
  local_38;
  long local_30;
  undefined1 local_15;
  int local_14;
  
  local_15 = 0;
  __lhs = in_RDI;
  local_14 = in_EDX;
  std::__cxx11::string::string((string *)in_RDI);
  if (0 < local_14) {
    std::__cxx11::string::append((char *)__lhs);
    std::__cxx11::string::append((ulong)__lhs,(char)local_14 * '\x02');
  }
  std::__cxx11::string::append((char *)__lhs);
  local_30 = in_RSI + 0x18;
  local_38._M_current =
       (jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        **)std::
           vector<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::allocator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*>_>
           ::begin(in_stack_ffffffffffffff78);
  local_40 = (jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              **)std::
                 vector<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::allocator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*>_>
                 ::end(in_stack_ffffffffffffff78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*const_*,_std::vector<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::allocator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*>_>_>
                             *)__lhs,(__normal_iterator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*const_*,_std::vector<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::allocator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*>_>_>
                                      *)in_stack_ffffffffffffff78), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*const_*,_std::vector<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::allocator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*>_>_>
               ::operator*(&local_38);
    (*(*local_48)->_vptr_jsonpath_selector[5])(local_68,*local_48,(ulong)(local_14 + 1));
    std::__cxx11::string::append((string *)__lhs);
    std::__cxx11::string::~string(local_68);
    __gnu_cxx::
    __normal_iterator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*const_*,_std::vector<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::allocator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*>_>_>
    ::operator++(&local_38);
  }
  return in_RDI;
}

Assistant:

std::string to_string(int level) const override
        {
            std::string s;
            if (level > 0)
            {
                s.append("\n");
                s.append(std::size_t(level)*2, ' ');
            }
            s.append("union selector ");
            for (auto& selector : selectors_)
            {
                s.append(selector->to_string(level+1));
                //s.push_back('\n');
            }

            return s;
        }